

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O0

SessionFactory *
FileReceiveSession::create_session_factory(SessionFactory *__return_storage_ptr__,path *target)

{
  path local_38;
  path *local_18;
  path *target_local;
  
  local_18 = target;
  target_local = (path *)__return_storage_ptr__;
  boost::filesystem::path::path(&local_38,target);
  std::function<std::shared_ptr<Subscriber>(Poll&,TCPServer&,sockaddr_in)>::
  function<FileReceiveSession::create_session_factory(boost::filesystem::path)::__0,void>
            ((function<std::shared_ptr<Subscriber>(Poll&,TCPServer&,sockaddr_in)> *)
             __return_storage_ptr__,(anon_class_32_1_6ca262cf *)&local_38);
  create_session_factory(boost::filesystem::path)::$_0::~__0((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

TCPServer::SessionFactory FileReceiveSession::create_session_factory(boost::filesystem::path target) {
  return [=](Poll &p, TCPServer &server, sockaddr_in ad) -> std::shared_ptr<Subscriber> {
    p.unsubscribe(server);
    auto s = std::make_shared<FileReceiveSession>(target);
    s->when_error([](auto p) { std::cout << "Error in receiving file " << p << std::endl; });
    s->when_sucess([](auto p) { std::cout << "Received file " << p << std::endl; });
    return s;
  };
}